

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O3

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::AutoLink(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,NodeRange nr)

{
  pointer *ppNVar1;
  iterator __position;
  NodeRange NVar2;
  NodeRange local_18;
  
  local_18.ir_ = nr.ir_;
  local_18.pvn_ = nr.pvn_;
  if (((this->auto_link_src_item_).pvn_ != (ValueNode *)0x0) &&
     ((this->auto_link_src_item_).ir_.beg_ < (this->auto_link_src_item_).ir_.end_)) {
    __position._M_current =
         (this->auto_link_targ_items_).
         super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (((this->auto_link_targ_items_).
         super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
         super__Vector_impl_data._M_start == __position._M_current) ||
       ((__position._M_current[-1].pvn_ != local_18.pvn_ ||
        (__position._M_current[-1].ir_.end_ != nr.ir_.beg_)))) {
      if (__position._M_current ==
          (this->auto_link_targ_items_).
          super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<mp::pre::NodeRange,std::allocator<mp::pre::NodeRange>>::
        _M_realloc_insert<mp::pre::NodeRange_const&>
                  ((vector<mp::pre::NodeRange,std::allocator<mp::pre::NodeRange>> *)
                   &this->auto_link_targ_items_,__position,&local_18);
      }
      else {
        (__position._M_current)->pvn_ = local_18.pvn_;
        (__position._M_current)->ir_ = local_18.ir_;
        ppNVar1 = &(this->auto_link_targ_items_).
                   super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppNVar1 = *ppNVar1 + 1;
      }
    }
    else {
      __position._M_current[-1].ir_.end_ = nr.ir_.end_;
    }
  }
  NVar2.ir_ = local_18.ir_;
  NVar2.pvn_ = local_18.pvn_;
  return NVar2;
}

Assistant:

pre::NodeRange AutoLink(pre::NodeRange nr) {
    if (DoingAutoLinking()) {
      if (auto_link_targ_items_.empty() ||
          !auto_link_targ_items_.back().TryExtendBy(nr))
        auto_link_targ_items_.push_back(nr);
    }
    return nr;
  }